

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O0

X509_VERIFY_PARAM * X509_VERIFY_PARAM_lookup(char *name)

{
  int iVar1;
  char *name_local;
  
  iVar1 = strcmp(name,"default");
  if (iVar1 == 0) {
    name_local = "";
  }
  else {
    iVar1 = strcmp(name,"pkcs7");
    if (iVar1 == 0) {
      name_local = "";
    }
    else {
      iVar1 = strcmp(name,"smime_sign");
      if (iVar1 == 0) {
        name_local = "";
      }
      else {
        iVar1 = strcmp(name,"ssl_client");
        if (iVar1 == 0) {
          name_local = "";
        }
        else {
          iVar1 = strcmp(name,"ssl_server");
          if (iVar1 == 0) {
            name_local = "";
          }
          else {
            name_local = (char *)0x0;
          }
        }
      }
    }
  }
  return (X509_VERIFY_PARAM *)name_local;
}

Assistant:

const X509_VERIFY_PARAM *X509_VERIFY_PARAM_lookup(const char *name) {
  if (strcmp(name, "default") == 0) {
    return &kDefaultParam;
  }
  if (strcmp(name, "pkcs7") == 0) {
    // PKCS#7 and S/MIME signing use the same defaults.
    return &kSMIMESignParam;
  }
  if (strcmp(name, "smime_sign") == 0) {
    return &kSMIMESignParam;
  }
  if (strcmp(name, "ssl_client") == 0) {
    return &kSSLClientParam;
  }
  if (strcmp(name, "ssl_server") == 0) {
    return &kSSLServerParam;
  }
  return NULL;
}